

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructHelpers.h
# Opt level: O3

void Corrade::Containers::Implementation::
     construct<Corrade::Utility::Arguments::Entry,Corrade::Utility::Arguments::Type,char,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long>
               (Entry *value,Type *first,char *next,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_3,
               unsigned_long *next_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Type type;
  char shortKey;
  string local_80;
  string local_60;
  string local_40;
  
  type = *first;
  shortKey = *next;
  local_60._M_dataplus._M_p = (next_1->_M_dataplus)._M_p;
  paVar1 = &next_1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == paVar1) {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_60.field_2._8_8_ = *(undefined8 *)((long)&next_1->field_2 + 8);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_60._M_string_length = next_1->_M_string_length;
  (next_1->_M_dataplus)._M_p = (pointer)paVar1;
  next_1->_M_string_length = 0;
  (next_1->field_2)._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (next_2->_M_dataplus)._M_p;
  paVar1 = &next_2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == paVar1) {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&next_2->field_2 + 8);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_80._M_string_length = next_2->_M_string_length;
  (next_2->_M_dataplus)._M_p = (pointer)paVar1;
  next_2->_M_string_length = 0;
  (next_2->field_2)._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (next_3->_M_dataplus)._M_p;
  paVar1 = &next_3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar1) {
    local_40.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_40.field_2._8_8_ = *(undefined8 *)((long)&next_3->field_2 + 8);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_40._M_string_length = next_3->_M_string_length;
  (next_3->_M_dataplus)._M_p = (pointer)paVar1;
  next_3->_M_string_length = 0;
  (next_3->field_2)._M_local_buf[0] = '\0';
  Utility::Arguments::Entry::Entry(value,type,shortKey,&local_60,&local_80,&local_40,*next_4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

inline void construct(T& value, First&& first, Next&& ...next) {
    new(&value) T{Utility::forward<First>(first), Utility::forward<Next>(next)...};
}